

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0Config::adjust_orig_mthd(MthdEmuEmuD3D0Config *this)

{
  result_type rVar1;
  MthdEmuEmuD3D0Config *this_local;
  
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.rnd);
  if ((rVar1 & 1) != 0) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xfffffff0 | 1;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      rVar1 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      (this->super_SingleMthdTest).super_MthdTest.val =
           1 << ((byte)rVar1 & 0x1f) ^ (this->super_SingleMthdTest).super_MthdTest.val;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      rVar1 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      (this->super_SingleMthdTest).super_MthdTest.val =
           1 << ((byte)rVar1 & 0x1f) ^ (this->super_SingleMthdTest).super_MthdTest.val;
    }
  }
  adjust_orig_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			if (rnd() & 3)
				insrt(val, 0, 4, 1);
			if (rnd() & 1) {
				val ^= 1 << (rnd() & 0x1f);
			}
			if (rnd() & 1) {
				val ^= 1 << (rnd() & 0x1f);
			}
		}
		adjust_orig_icmd(&orig);
	}